

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O2

bool __thiscall stk::FileRead::getMatInfo(FileRead *this,char *fileName)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  ostream *poVar8;
  undefined1 *puVar9;
  long lVar10;
  StkFormat SVar11;
  unsigned_long uVar12;
  long __off;
  FILE *__stream;
  float fVar13;
  double dVar14;
  char rate;
  undefined1 uStack_8f;
  undefined2 uStack_8e;
  undefined4 uStack_8c;
  SINT32 namesize;
  char mi [2];
  UINT32 type;
  char name [3];
  SINT32 nametype;
  SINT32 columns;
  SINT32 rows;
  SINT32 chunkSize;
  char head [5];
  StkFormat local_38;
  
  iVar4 = fseek((FILE *)this->fd_,0,0);
  if ((iVar4 != -1) && (sVar6 = fread(head,4,1,(FILE *)this->fd_), sVar6 == 1)) {
    head[4] = '\0';
    pcVar7 = strchr(head,0x30);
    if (pcVar7 != (char *)0x0) {
      poVar8 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,"FileRead: ");
      puVar9 = std::operator<<(poVar8,fileName);
      pcVar7 = " appears to be a Version 4 MAT-file, which is not currently supported.";
      goto LAB_0010c867;
    }
    this->byteswap_ = false;
    iVar4 = fseek((FILE *)this->fd_,0x7e,0);
    if ((iVar4 != -1) && (sVar6 = fread(mi,2,1,(FILE *)this->fd_), sVar6 == 1)) {
      if (mi == (char  [2])0x494d) {
        this->byteswap_ = true;
      }
      else if (mi != (char  [2])0x4d49) goto LAB_0010c83f;
      local_38 = 1;
      bVar3 = false;
      bVar2 = false;
      bVar1 = false;
LAB_0010c8de:
      do {
        if (bVar3) {
          return true;
        }
        lVar10 = ftell((FILE *)this->fd_);
        bVar3 = findNextMatArray(this,&chunkSize,&rows,&columns,&nametype);
        if (!bVar3) {
          if (bVar2) {
            if (bVar1) {
              return true;
            }
            this->fileRate_ = 44100.0;
            std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                            "FileRead: No sample rate found ... assuming 44100.0");
            Stk::handleError(&this->super_Stk,WARNING);
            return true;
          }
          poVar8 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                                   "FileRead: No audio data found in MAT-file (");
          puVar9 = std::operator<<(poVar8,fileName);
          pcVar7 = ").";
          goto LAB_0010c867;
        }
        if (!(bool)(columns == 1 & rows == 1 & ~bVar1)) {
          if (bVar2) goto switchD_0010ca9a_caseD_8;
          if (columns <= rows) {
            puVar9 = Stk::oStream__abi_cxx11_;
            pcVar7 = 
            "FileRead: Transpose the MAT-file array so that audio channels fill matrix rows (not columns)."
            ;
            goto LAB_0010c867;
          }
          this->channels_ = rows;
          this->fileSize_ = (long)columns;
          rate = '\x04';
          uStack_8f = 0;
          uStack_8e = 0;
          __stream = (FILE *)this->fd_;
          if (nametype == 1) {
            sVar6 = fread(&rate,4,1,__stream);
            if (sVar6 != 1) break;
            if (this->byteswap_ == true) {
              Stk::swap32((uchar *)&rate);
            }
            fVar13 = ceilf((float)CONCAT22(uStack_8e,CONCAT11(uStack_8f,rate)) * 0.125);
            iVar4 = (int)fVar13;
            rate = (char)iVar4;
            uStack_8f = (undefined1)((uint)iVar4 >> 8);
            uStack_8e = (undefined2)((uint)iVar4 >> 0x10);
            __stream = (FILE *)this->fd_;
            __off = (long)(iVar4 << 3);
          }
          else {
            __off = 4;
          }
          iVar4 = fseek(__stream,__off,1);
          if ((iVar4 != -1) && (sVar6 = fread(&namesize,4,1,(FILE *)this->fd_), sVar6 == 1)) {
            if (this->byteswap_ == true) {
              Stk::swap32((uchar *)&namesize);
            }
            SVar11 = local_38;
            switch(namesize) {
            case 1:
              break;
            default:
              poVar8 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                                       "FileRead: The MAT-file array data format (");
              puVar9 = (undefined1 *)std::ostream::operator<<(poVar8,namesize);
              pcVar7 = ") is not supported.";
              goto LAB_0010c867;
            case 3:
              SVar11 = 2;
              break;
            case 5:
              SVar11 = 8;
              break;
            case 7:
              SVar11 = 0x10;
              break;
            case 9:
              SVar11 = 0x20;
            }
            this->dataType_ = SVar11;
            iVar4 = fseek((FILE *)this->fd_,4,1);
            if (iVar4 != -1) {
              uVar12 = ftell((FILE *)this->fd_);
              this->dataOffset_ = uVar12;
              bVar2 = true;
              goto LAB_0010ca4b;
            }
          }
          break;
        }
        namesize = 4;
        if (nametype == 1) {
          sVar6 = fread(&namesize,4,1,(FILE *)this->fd_);
          if (sVar6 != 1) break;
          if (this->byteswap_ == true) {
            Stk::swap32((uchar *)&namesize);
          }
          if (namesize != 2) goto switchD_0010ca9a_caseD_8;
          namesize = 8;
        }
        name[2] = '\0';
        sVar6 = fread(name,2,1,(FILE *)this->fd_);
        if (sVar6 != 1) break;
        if (name._0_2_ != 0x7366) goto switchD_0010ca9a_caseD_8;
        iVar4 = fseek((FILE *)this->fd_,(long)namesize + -2,1);
        if ((iVar4 == -1) || (sVar6 = fread(&type,4,1,(FILE *)this->fd_), sVar6 != 1)) break;
        if (this->byteswap_ == true) {
          Stk::swap32((uchar *)&type);
        }
        if (type < 0x10000) {
          iVar4 = fseek((FILE *)this->fd_,4,1);
          if (iVar4 == -1) break;
        }
        else {
          type = type & 0xffff;
        }
        switch(type) {
        case 1:
          sVar6 = fread(&rate,1,1,(FILE *)this->fd_);
          if (sVar6 == 1) {
            uVar5 = (uint)rate;
            goto LAB_0010cc83;
          }
          goto LAB_0010c83f;
        case 2:
          sVar6 = fread(&rate,1,1,(FILE *)this->fd_);
          if (sVar6 == 1) {
            uVar5 = (uint)(byte)rate;
            goto LAB_0010cc83;
          }
          goto LAB_0010c83f;
        case 3:
          sVar6 = fread(&rate,2,1,(FILE *)this->fd_);
          if (sVar6 == 1) {
            if (this->byteswap_ == true) {
              Stk::swap16((uchar *)&rate);
            }
            uVar5 = (uint)CONCAT11(uStack_8f,rate);
            goto LAB_0010cc83;
          }
          goto LAB_0010c83f;
        case 4:
          sVar6 = fread(&rate,2,1,(FILE *)this->fd_);
          if (sVar6 != 1) goto LAB_0010c83f;
          if (this->byteswap_ == true) {
            Stk::swap16((uchar *)&rate);
          }
          uVar5 = (uint)CONCAT11(uStack_8f,rate);
LAB_0010cc83:
          dVar14 = (double)(int)uVar5;
          break;
        case 5:
          sVar6 = fread(&rate,4,1,(FILE *)this->fd_);
          if (sVar6 != 1) goto LAB_0010c83f;
          if (this->byteswap_ == true) {
            Stk::swap32((uchar *)&rate);
          }
          dVar14 = (double)CONCAT22(uStack_8e,CONCAT11(uStack_8f,rate));
          break;
        case 6:
          sVar6 = fread(&rate,4,1,(FILE *)this->fd_);
          if (sVar6 != 1) goto LAB_0010c83f;
          if (this->byteswap_ == true) {
            Stk::swap32((uchar *)&rate);
          }
          dVar14 = (double)CONCAT22(uStack_8e,CONCAT11(uStack_8f,rate));
          break;
        case 7:
          sVar6 = fread(&rate,4,1,(FILE *)this->fd_);
          if (sVar6 != 1) goto LAB_0010c83f;
          if (this->byteswap_ == true) {
            Stk::swap32((uchar *)&rate);
          }
          dVar14 = (double)(float)CONCAT22(uStack_8e,CONCAT11(uStack_8f,rate));
          break;
        default:
          goto switchD_0010ca9a_caseD_8;
        case 9:
          sVar6 = fread(&rate,8,1,(FILE *)this->fd_);
          if (sVar6 != 1) goto LAB_0010c83f;
          if (this->byteswap_ == true) {
            Stk::swap64((uchar *)&rate);
          }
          dVar14 = (double)CONCAT44(uStack_8c,CONCAT22(uStack_8e,CONCAT11(uStack_8f,rate)));
        }
        bVar1 = true;
        if (0.0 < dVar14) {
          this->fileRate_ = dVar14;
          bVar1 = true;
        }
switchD_0010ca9a_caseD_8:
        if (bVar2) {
LAB_0010ca4b:
          bVar3 = true;
          if (bVar1) goto LAB_0010c8de;
        }
        bVar3 = false;
        iVar4 = fseek((FILE *)this->fd_,lVar10 + chunkSize + 8,0);
      } while (iVar4 != -1);
    }
  }
LAB_0010c83f:
  poVar8 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,"FileRead: Error reading MAT-file (")
  ;
  puVar9 = std::operator<<(poVar8,fileName);
  pcVar7 = ") header.";
LAB_0010c867:
  std::operator<<((ostream *)puVar9,pcVar7);
  return false;
}

Assistant:

bool FileRead :: getMatInfo( const char *fileName )
{
  // MAT-file formatting information is available at:
  // http://www.mathworks.com/access/helpdesk/help/pdf_doc/matlab/matfile_format.pdf

  // Verify this is a version 5 MAT-file format.
  char head[5];
  if ( fseek(fd_, 0, SEEK_SET) == -1 ) goto error;
  if ( fread(&head, 4, 1, fd_) != 1 ) goto error;
  // If any of the first 4 characters of the header = 0, then this is
  // a Version 4 MAT-file.
  head[4] = '\0';
  if ( strstr(head, "0") ) {
    oStream_ << "FileRead: " << fileName << " appears to be a Version 4 MAT-file, which is not currently supported.";
    return false;
  }

  // Determine the endian-ness of the file.
  char mi[2];
  byteswap_ = false;
  // Locate "M" and "I" characters in header.
  if ( fseek(fd_, 126, SEEK_SET) == -1 ) goto error;
  if ( fread(&mi, 2, 1, fd_) != 1) goto error;
#ifdef __LITTLE_ENDIAN__
  if ( !strncmp(mi, "MI", 2) )
    byteswap_ = true;
  else if ( strncmp(mi, "IM", 2) ) goto error;
#else
  if ( !strncmp(mi, "IM", 2))
    byteswap_ = true;
  else if ( strncmp(mi, "MI", 2) ) goto error;
#endif

  // We are expecting a data element containing the audio data and an
  // optional data element containing the sample rate (with an array
  // name of "fs").  Both elements should be stored as a Matlab array
  // type (14).

  bool doneParsing, haveData, haveSampleRate;
  SINT32 chunkSize, rows, columns, nametype;
  long dataoffset;
  doneParsing = false;
  haveData = false;
  haveSampleRate = false;
  while ( !doneParsing ) {

    dataoffset = ftell( fd_ ); // save location in file
    if ( findNextMatArray( &chunkSize, &rows, &columns, &nametype ) == false ) {
      // No more Matlab array type chunks found.
      if ( !haveData ) {
        oStream_ << "FileRead: No audio data found in MAT-file (" << fileName << ").";
        return false;
      }
      else if ( !haveSampleRate ) {
        fileRate_ = 44100.0;
        oStream_ << "FileRead: No sample rate found ... assuming 44100.0";
        handleError( StkError::WARNING );
        return true;
      }
      else return true;
    }

    if ( !haveSampleRate && rows == 1 && columns == 1 ) { // Parse for sample rate.

      SINT32 namesize = 4;
      if ( nametype == 1 ) { // array name > 4 characters
        if ( fread(&namesize, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&namesize);
        if ( namesize != 2 ) goto tryagain; // expecting name = "fs"
        namesize = 8; // field must be padded to multiple of 8 bytes
      }
      char name[3]; name[2] = '\0';
      if ( fread(&name, 2, 1, fd_) != 1) goto error;
      if ( strncmp(name, "fs", 2) ) goto tryagain;

      // Jump to real part data subelement, which is likely to be in a
      // small data format.
      if ( fseek(fd_, namesize-2, SEEK_CUR) == -1 ) goto error;
      UINT32 type;
      StkFloat srate;
      if ( fread(&type, 4, 1, fd_) != 1 ) goto error;
      if ( byteswap_ ) swap32((unsigned char *)&type);
      if ( (type & 0xffff0000) != 0 ) // small data format
        type = (type & 0x0000ffff);
      else
        if ( fseek(fd_, 4, SEEK_CUR) == -1 ) goto error;
      if ( type == 1 ) { // SINT8
        signed char rate;
        if ( fread(&rate, 1, 1, fd_) != 1 ) goto error;
        srate = (StkFloat) rate;
      }
      else if ( type == 2 ) { // UINT8
        unsigned char rate;
        if ( fread(&rate, 1, 1, fd_) != 1 ) goto error;
        srate = (StkFloat) rate;
      }
      else if ( type == 3 ) { // SINT16
        SINT16 rate;
        if ( fread(&rate, 2, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap16((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 4 ) { // UINT16
        UINT16 rate;
        if ( fread(&rate, 2, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap16((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 5 ) { // SINT32
        SINT32 rate;
        if ( fread(&rate, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 6 ) { // UINT32
        UINT32 rate;
        if ( fread(&rate, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 7 ) { // FLOAT32
        FLOAT32 rate;
        if ( fread(&rate, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else if ( type == 9 ) { // FLOAT64
        FLOAT64 rate;
        if ( fread(&rate, 8, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap64((unsigned char *)&rate);
        srate = (StkFloat) rate;
      }
      else
        goto tryagain;

      if ( srate > 0 ) fileRate_ = srate;
      haveSampleRate = true;
    }
    else if ( !haveData ) { // Parse for data.

      // Assume channels = smaller of rows or columns.
      if ( rows < columns ) {
        channels_ = rows;
        fileSize_ = columns;
      }
      else {
        oStream_ << "FileRead: Transpose the MAT-file array so that audio channels fill matrix rows (not columns).";
        return false;
      }

      SINT32 namesize = 4;
      if ( nametype == 1 ) { // array name > 4 characters
        if ( fread(&namesize, 4, 1, fd_) != 1 ) goto error;
        if ( byteswap_ ) swap32((unsigned char *)&namesize);
        namesize = (SINT32) ceil((float)namesize / 8);
        if ( fseek( fd_, namesize*8, SEEK_CUR) == -1 ) goto error;  // jump over array name
      }
      else {
        if ( fseek( fd_, 4, SEEK_CUR ) == -1 ) goto error;
      }

      // Now at real part data subelement
      SINT32 type;
      if ( fread(&type, 4, 1, fd_) != 1 ) goto error;
      if ( byteswap_ ) swap32((unsigned char *)&type);
      if ( type == 1 )  dataType_ = STK_SINT8;
      else if ( type == 3 ) dataType_ = STK_SINT16;
      else if ( type == 5 ) dataType_ = STK_SINT32;
      else if ( type == 7 ) dataType_ = STK_FLOAT32;
      else if ( type == 9 ) dataType_ = STK_FLOAT64;
      else {
        oStream_ << "FileRead: The MAT-file array data format (" << type << ") is not supported.";
        return false;
      }

      // Jump to the data.
      if ( fseek(fd_, 4, SEEK_CUR) == -1 ) goto error;
      dataOffset_ = ftell(fd_);
      haveData = true;
    }

  tryagain:
    if ( haveData && haveSampleRate ) doneParsing = true;
    else // jump to end of data element and keep trying
      if ( fseek( fd_, dataoffset+chunkSize+8, SEEK_SET) == -1 ) goto error;
  }

  return true;

 error:
  oStream_ << "FileRead: Error reading MAT-file (" << fileName << ") header.";
  return false;
}